

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_Include::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  Template *pTVar14;
  allocator local_699;
  string local_698 [39];
  allocator local_671;
  string local_670 [32];
  Template *local_650;
  Template *tpl7;
  string local_640 [39];
  allocator local_619;
  string local_618 [32];
  Template *local_5f8;
  Template *tpl6;
  string local_5e8 [39];
  allocator local_5c1;
  string local_5c0 [32];
  Template *local_5a0;
  Template *tpl5;
  string local_590 [39];
  allocator local_569;
  string local_568 [32];
  Template *local_548;
  Template *tpl4;
  string local_538 [39];
  allocator local_511;
  string local_510 [32];
  Template *local_4f0;
  Template *tpl3;
  string local_4e0 [39];
  allocator local_4b9;
  string local_4b8 [32];
  Template *local_498;
  Template *tpl2;
  string local_488 [32];
  TemplateString local_468;
  TemplateString local_448;
  allocator local_421;
  string local_420 [32];
  TemplateString local_400;
  TemplateString local_3e0;
  allocator local_3b9;
  string local_3b8 [32];
  TemplateString local_398;
  TemplateString local_378;
  allocator local_351;
  string local_350 [32];
  TemplateString local_330;
  TemplateString local_310;
  allocator local_2e9;
  string local_2e8 [32];
  TemplateString local_2c8;
  TemplateString local_2a8;
  allocator local_281;
  string local_280 [32];
  TemplateString local_260;
  TemplateString local_240;
  allocator local_219;
  string local_218 [32];
  TemplateString local_1f8;
  allocator local_1d1;
  string local_1d0 [32];
  TemplateString local_1b0;
  TemplateDictionary local_190 [8];
  TemplateDictionary dict;
  allocator local_119;
  string local_118 [32];
  Template *local_f8;
  Template *tpl;
  string local_e8 [32];
  ctemplate local_c8 [8];
  string incname_bad;
  allocator local_a1;
  string local_a0 [32];
  ctemplate local_80 [8];
  string incname2;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string incname;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"include file\n",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"inc2a\ninc2b\n",&local_a1);
  ctemplate::StringToTemplateFile(local_80,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"{{syntax_error",(allocator *)((long)&tpl + 7));
  ctemplate::StringToTemplateFile(local_c8,(string *)local_e8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"hi {{>INC}} bar\n",&local_119);
  pTVar14 = ctemplate::StringToTemplate((string *)local_118,STRIP_WHITESPACE);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  local_f8 = pTVar14;
  ctemplate::TemplateString::TemplateString(&local_1b0,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_190,&local_1b0,(UnsafeArena *)0x0);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"hi  bar",&local_1d1);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_1d0,true);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  ctemplate::TemplateString::TemplateString(&local_1f8,"INC");
  TVar1.length_ = local_1f8.length_;
  TVar1.ptr_ = local_1f8.ptr_;
  TVar1.is_immutable_ = local_1f8.is_immutable_;
  TVar1._17_7_ = local_1f8._17_7_;
  TVar1.id_ = local_1f8.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"hi  bar",&local_219);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_218,true);
  std::__cxx11::string::~string(local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  ctemplate::TemplateString::TemplateString(&local_240,"INC");
  TVar2.length_ = local_240.length_;
  TVar2.ptr_ = local_240.ptr_;
  TVar2.is_immutable_ = local_240.is_immutable_;
  TVar2._17_7_ = local_240._17_7_;
  TVar2.id_ = local_240.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar2);
  ctemplate::TemplateString::TemplateString(&local_260,"/notarealfile ");
  TVar3.length_ = local_260.length_;
  TVar3.ptr_ = local_260.ptr_;
  TVar3.is_immutable_ = local_260.is_immutable_;
  TVar3._17_7_ = local_260._17_7_;
  TVar3.id_ = local_260.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar3);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"hi  bar",&local_281);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_280,false);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  ctemplate::TemplateString::TemplateString(&local_2a8,"INC");
  TVar4.length_ = local_2a8.length_;
  TVar4.ptr_ = local_2a8.ptr_;
  TVar4.is_immutable_ = local_2a8.is_immutable_;
  TVar4._17_7_ = local_2a8._17_7_;
  TVar4.id_ = local_2a8.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar4);
  ctemplate::TemplateString::TemplateString(&local_2c8,(string *)local_28);
  TVar5.length_ = local_2c8.length_;
  TVar5.ptr_ = local_2c8.ptr_;
  TVar5.is_immutable_ = local_2c8.is_immutable_;
  TVar5._17_7_ = local_2c8._17_7_;
  TVar5.id_ = local_2c8.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar5);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"hi include file bar",&local_2e9);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_2e8,false);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  ctemplate::TemplateString::TemplateString(&local_310,"INC");
  TVar6.length_ = local_310.length_;
  TVar6.ptr_ = local_310.ptr_;
  TVar6.is_immutable_ = local_310.is_immutable_;
  TVar6._17_7_ = local_310._17_7_;
  TVar6.id_ = local_310.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar6);
  ctemplate::TemplateString::TemplateString(&local_330,(string *)local_c8);
  TVar7.length_ = local_330.length_;
  TVar7.ptr_ = local_330.ptr_;
  TVar7.is_immutable_ = local_330.is_immutable_;
  TVar7._17_7_ = local_330._17_7_;
  TVar7.id_ = local_330.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar7);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_350,"hi include file bar",&local_351);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_350,false);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  ctemplate::TemplateString::TemplateString(&local_378,"INC");
  TVar8.length_ = local_378.length_;
  TVar8.ptr_ = local_378.ptr_;
  TVar8.is_immutable_ = local_378.is_immutable_;
  TVar8._17_7_ = local_378._17_7_;
  TVar8.id_ = local_378.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar8);
  ctemplate::TemplateString::TemplateString(&local_398,(string *)local_28);
  TVar9.length_ = local_398.length_;
  TVar9.ptr_ = local_398.ptr_;
  TVar9.is_immutable_ = local_398.is_immutable_;
  TVar9._17_7_ = local_398._17_7_;
  TVar9.id_ = local_398.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar9);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"hi include fileinclude file bar",&local_3b9);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_3b8,false);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  ctemplate::TemplateString::TemplateString(&local_3e0,"inc");
  TVar10.length_ = local_3e0.length_;
  TVar10.ptr_ = local_3e0.ptr_;
  TVar10.is_immutable_ = local_3e0.is_immutable_;
  TVar10._17_7_ = local_3e0._17_7_;
  TVar10.id_ = local_3e0.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar10);
  ctemplate::TemplateString::TemplateString(&local_400,(string *)local_28);
  TVar11.length_ = local_400.length_;
  TVar11.ptr_ = local_400.ptr_;
  TVar11.is_immutable_ = local_400.is_immutable_;
  TVar11._17_7_ = local_400._17_7_;
  TVar11.id_ = local_400.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar11);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"hi include fileinclude file bar",&local_421);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_420,false);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  ctemplate::TemplateString::TemplateString(&local_448,"INC");
  TVar12.length_ = local_448.length_;
  TVar12.ptr_ = local_448.ptr_;
  TVar12.is_immutable_ = local_448.is_immutable_;
  TVar12._17_7_ = local_448._17_7_;
  TVar12.id_ = local_448.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar12);
  ctemplate::TemplateString::TemplateString(&local_468,(string *)local_80);
  TVar13.length_ = local_468.length_;
  TVar13.ptr_ = local_468.ptr_;
  TVar13.is_immutable_ = local_468.is_immutable_;
  TVar13._17_7_ = local_468._17_7_;
  TVar13.id_ = local_468.id_;
  ctemplate::TemplateDictionary::SetFilename(TVar13);
  pTVar14 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_488,"hi include fileinclude fileinc2ainc2b bar",(allocator *)((long)&tpl2 + 7));
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_488,false);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl2 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"hi {{>INC}} bar",&local_4b9);
  pTVar14 = ctemplate::StringToTemplate((string *)local_4b8,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b9);
  local_498 = pTVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4e0,"hi include file\ninclude file\ninc2a\ninc2b\n bar",
             (allocator *)((long)&tpl3 + 7));
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_4e0,false);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl3 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_510,"hi\n  {{>INC}} bar",&local_511);
  pTVar14 = ctemplate::StringToTemplate((string *)local_510,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  local_4f0 = pTVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_538,"hi\n  include file\n  include file\n  inc2a\n  inc2b\n   bar",
             (allocator *)((long)&tpl4 + 7));
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_538,false);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl4 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"hi\n  {{>INC}} bar",&local_569);
  pTVar14 = ctemplate::StringToTemplate((string *)local_568,STRIP_WHITESPACE);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  local_548 = pTVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_590,"hiinclude fileinclude fileinc2ainc2b bar",(allocator *)((long)&tpl5 + 7));
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_590,false);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl5 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"hi\n - {{>INC}} bar",&local_5c1);
  pTVar14 = ctemplate::StringToTemplate((string *)local_5c0,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  local_5a0 = pTVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5e8,"hi\n - include file\ninclude file\ninc2a\ninc2b\n bar",
             (allocator *)((long)&tpl6 + 7));
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_5e8,false);
  std::__cxx11::string::~string(local_5e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl6 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"  {{>INC}}\nbar",&local_619);
  pTVar14 = ctemplate::StringToTemplate((string *)local_618,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  local_5f8 = pTVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_640,"  include file\n  include file\n  inc2a\n  inc2b\n  \nbar",
             (allocator *)((long)&tpl7 + 7));
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_640,false);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl7 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_670,"  {{>INC}}-{{>INC}}",&local_671);
  pTVar14 = ctemplate::StringToTemplate((string *)local_670,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_670);
  std::allocator<char>::~allocator((allocator<char> *)&local_671);
  local_650 = pTVar14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_698,
             "  include file\n  include file\n  inc2a\n  inc2b\n  -include file\ninclude file\ninc2a\ninc2b\n"
             ,&local_699);
  ctemplate::AssertExpandIs(pTVar14,local_190,(string *)local_698,false);
  std::__cxx11::string::~string(local_698);
  std::allocator<char>::~allocator((allocator<char> *)&local_699);
  ctemplate::TemplateDictionary::~TemplateDictionary(local_190);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

TEST(Template, Include) {
  string incname = StringToTemplateFile("include file\n");
  string incname2 = StringToTemplateFile("inc2a\ninc2b\n");
  string incname_bad = StringToTemplateFile("{{syntax_error");
  Template* tpl = StringToTemplate("hi {{>INC}} bar\n", STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  AssertExpandIs(tpl, &dict, "hi  bar", true);
  dict.AddIncludeDictionary("INC");
  AssertExpandIs(tpl, &dict, "hi  bar", true);   // noop: no filename was set
  dict.AddIncludeDictionary("INC")->SetFilename("/notarealfile ");
  AssertExpandIs(tpl, &dict, "hi  bar", false);   // noop: illegal filename
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl, &dict, "hi include file bar", false);
  dict.AddIncludeDictionary("INC")->SetFilename(incname_bad);
  AssertExpandIs(tpl, &dict, "hi include file bar",
                 false);  // noop: syntax error
  dict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl, &dict, "hi include fileinclude file bar", false);
  dict.AddIncludeDictionary("inc")->SetFilename(incname);
  AssertExpandIs(tpl, &dict, "hi include fileinclude file bar", false);
  dict.AddIncludeDictionary("INC")->SetFilename(incname2);
  AssertExpandIs(tpl, &dict,
                 "hi include fileinclude fileinc2ainc2b bar", false);

  // Now test that includes preserve Strip
  Template* tpl2 = StringToTemplate("hi {{>INC}} bar", DO_NOT_STRIP);
  AssertExpandIs(tpl2, &dict,
                 "hi include file\ninclude file\ninc2a\ninc2b\n bar", false);

  // Test that if we indent the include, every line on the include
  // is indented.
  Template* tpl3 = StringToTemplate("hi\n  {{>INC}} bar", DO_NOT_STRIP);
  AssertExpandIs(tpl3, &dict,
                 "hi\n  include file\n  include file\n"
                 "  inc2a\n  inc2b\n   bar",
                 false);
  // But obviously, if we strip leading whitespace, no indentation.
  Template* tpl4 = StringToTemplate("hi\n  {{>INC}} bar", STRIP_WHITESPACE);
  AssertExpandIs(tpl4, &dict,
                 "hiinclude fileinclude fileinc2ainc2b bar", false);
  // And if it's not a whitespace indent, we don't indent either.
  Template* tpl5 = StringToTemplate("hi\n - {{>INC}} bar", DO_NOT_STRIP);
  AssertExpandIs(tpl5, &dict,
                 "hi\n - include file\ninclude file\n"
                 "inc2a\ninc2b\n bar",
                 false);
  // Make sure we indent properly at the beginning.
  Template* tpl6 = StringToTemplate("  {{>INC}}\nbar", DO_NOT_STRIP);
  AssertExpandIs(tpl6, &dict,
                 "  include file\n  include file\n"
                 "  inc2a\n  inc2b\n  \nbar",
                 false);
  // And deal correctly when we include twice in a row.
  Template* tpl7 = StringToTemplate("  {{>INC}}-{{>INC}}", DO_NOT_STRIP);
  AssertExpandIs(tpl7, &dict,
                 "  include file\n  include file\n  inc2a\n  inc2b\n  "
                 "-include file\ninclude file\ninc2a\ninc2b\n",
                 false);
}